

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddAllocatedInternal<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (void *param_1,void *param_2)

{
  Arena *this;
  Arena *value;
  void **ppvVar1;
  void **elems;
  Arena *arena;
  Arena *element_arena;
  Arena *in_stack_ffffffffffffffd0;
  
  this = (Arena *)GenericTypeHandler<google::protobuf::Message>::GetMaybeArenaPointer
                            ((Message *)0x4386e2);
  value = GetArenaNoVirtual((RepeatedPtrFieldBase *)param_1);
  if (((value == this) &&
      ((Rep *)(((Arena *)param_1)->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i
       != (Rep *)0x0)) &&
     (((Rep *)(((Arena *)param_1)->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i)
      ->allocated_size < *(int *)((long)&(((Arena *)param_1)->impl_).hint_._M_b._M_p + 4))) {
    ppvVar1 = ((Rep *)(((Arena *)param_1)->impl_).space_allocated_.
                      super___atomic_base<unsigned_long>._M_i)->elements;
    if (*(int *)&(((Arena *)param_1)->impl_).hint_._M_b._M_p <
        ((Rep *)(((Arena *)param_1)->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i
        )->allocated_size) {
      ppvVar1[((Rep *)(((Arena *)param_1)->impl_).space_allocated_.
                      super___atomic_base<unsigned_long>._M_i)->allocated_size] =
           ppvVar1[*(int *)&(((Arena *)param_1)->impl_).hint_._M_b._M_p];
    }
    ppvVar1[*(int *)&(((Arena *)param_1)->impl_).hint_._M_b._M_p] = param_2;
    *(int *)&(((Arena *)param_1)->impl_).hint_._M_b._M_p =
         *(int *)&(((Arena *)param_1)->impl_).hint_._M_b._M_p + 1;
    ((Rep *)(((Arena *)param_1)->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i)->
    allocated_size =
         ((Rep *)(((Arena *)param_1)->impl_).space_allocated_.super___atomic_base<unsigned_long>.
                 _M_i)->allocated_size + 1;
  }
  else {
    GenericTypeHandler<google::protobuf::Message>::GetArena((Message *)0x4387aa);
    AddAllocatedSlowWithCopy<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
              ((RepeatedPtrFieldBase *)this,(Type *)value,in_stack_ffffffffffffffd0,(Arena *)param_1
              );
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::AddAllocatedInternal(
    typename TypeHandler::Type* value, std::true_type) {
  Arena* element_arena =
      reinterpret_cast<Arena*>(TypeHandler::GetMaybeArenaPointer(value));
  Arena* arena = GetArenaNoVirtual();
  if (arena == element_arena && rep_ && rep_->allocated_size < total_size_) {
    // Fast path: underlying arena representation (tagged pointer) is equal to
    // our arena pointer, and we can add to array without resizing it (at least
    // one slot that is not allocated).
    void** elems = rep_->elements;
    if (current_size_ < rep_->allocated_size) {
      // Make space at [current] by moving first allocated element to end of
      // allocated list.
      elems[rep_->allocated_size] = elems[current_size_];
    }
    elems[current_size_] = value;
    current_size_ = current_size_ + 1;
    rep_->allocated_size = rep_->allocated_size + 1;
  } else {
    AddAllocatedSlowWithCopy<TypeHandler>(value, TypeHandler::GetArena(value),
                                          arena);
  }
}